

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

BrushData parseBrushValue(Value *v,QPalette *pal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double fy;
  CoordinateMode CVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  CoordinateMode CVar9;
  qsizetype qVar11;
  double *pdVar12;
  QColor *pQVar13;
  long lVar14;
  QPalette *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 *puVar15;
  QGradient *pQVar16;
  QGradientStops *this;
  int iVar17;
  long in_FS_OFFSET;
  byte bVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  BrushData BVar21;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  QLatin1StringView latin1_08;
  QLatin1StringView latin1_09;
  qsizetype local_290;
  qsizetype local_288;
  QLatin1String local_278;
  Parser parser;
  QArrayDataPointer<char16_t> local_228;
  QArrayDataPointer<QString> local_208;
  QArrayDataPointer<QString> local_1e8;
  QHash<QString,_double> local_1d0;
  QArrayDataPointer<std::pair<double,_QColor>_> local_1c8;
  QArrayDataPointer<QString> local_1a8;
  QArrayDataPointer<QString> local_188;
  pair<double,_QColor> local_168;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 local_128 [16];
  undefined8 local_118;
  QLinearGradient lg;
  Value local_b0;
  undefined1 local_88 [8];
  anon_union_24_3_e3d07ef4_for_data local_80;
  undefined8 local_68;
  Value local_60;
  long local_38;
  Spread SVar10;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCss::Value::Value(&local_60,(Value *)pal);
  parseColorValue((ColorData *)local_128,&local_60);
  QVariant::~QVariant(&local_60.variant);
  if (local_118._4_4_ == Role) {
    QCss::BrushData::BrushData((BrushData *)v,(ColorRole)local_118);
    uVar19 = extraout_RDX_00;
  }
  else if (local_118._4_4_ == Color) {
    QBrush::QBrush((QBrush *)&lg,(QColor *)local_128,SolidPattern);
    QCss::BrushData::BrushData((BrushData *)v,(QBrush *)&lg);
    QBrush::~QBrush((QBrush *)&lg);
    uVar19 = extraout_RDX;
  }
  else if (*(int *)&pal->d == 9) {
    local_188.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QVariant::toStringList();
    if ((undefined1 *)local_188.size == (undefined1 *)0x2) {
      local_1a8.d = (Data *)0x0;
      local_1a8.ptr = (QString *)0x0;
      local_1a8.size = 0;
      latin1.m_data = "qlineargradient";
      latin1.m_size = 0xf;
      QString::QString((QString *)&lg,latin1);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1a8,(QString *)&lg);
      latin1_00.m_data = "qradialgradient";
      latin1_00.m_size = 0xf;
      QString::QString((QString *)&parser,latin1_00);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1a8,(QString *)&parser);
      latin1_01.m_data = "qconicalgradient";
      latin1_01.m_size = 0x10;
      QString::QString((QString *)local_88,latin1_01);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1a8,(QString *)local_88);
      latin1_02.m_data = "qgradient";
      latin1_02.m_size = 9;
      QString::QString((QString *)&local_1c8,latin1_02);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1a8,(QString *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lg);
      QString::toLower_helper((QString *)&lg);
      qVar11 = QListSpecialMethods<QString>::indexOf
                         ((QListSpecialMethods<QString> *)&local_1a8,(QString *)&lg,0,CaseSensitive)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lg);
      iVar17 = (int)qVar11;
      if (iVar17 != -1) {
        local_1d0.d = (Data *)0x0;
        local_1c8.d = (Data *)0x0;
        local_1c8.ptr = (pair<double,_QColor> *)0x0;
        local_1c8.size = 0;
        local_1e8.d = (Data *)0x0;
        local_1e8.ptr = (QString *)0x0;
        local_1e8.size = 0;
        latin1_03.m_data = "pad";
        latin1_03.m_size = 3;
        QString::QString((QString *)&lg,latin1_03);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1e8,(QString *)&lg);
        latin1_04.m_data = "reflect";
        latin1_04.m_size = 7;
        QString::QString((QString *)&parser,latin1_04);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1e8,(QString *)&parser);
        latin1_05.m_data = "repeat";
        latin1_05.m_size = 6;
        QString::QString((QString *)local_88,latin1_05);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1e8,(QString *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lg);
        local_208.d = (Data *)0x0;
        local_208.ptr = (QString *)0x0;
        local_208.size = 0;
        latin1_06.m_data = "logical";
        latin1_06.m_size = 7;
        QString::QString((QString *)&lg,latin1_06);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_208,(QString *)&lg);
        latin1_07.m_data = "stretchtodevice";
        latin1_07.m_size = 0xf;
        QString::QString((QString *)&parser,latin1_07);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_208,(QString *)&parser);
        latin1_08.m_data = "objectbounding";
        latin1_08.m_size = 0xe;
        QString::QString((QString *)local_88,latin1_08);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_208,(QString *)local_88);
        latin1_09.m_data = "object";
        latin1_09.m_size = 6;
        QString::QString((QString *)&local_228,latin1_09);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_208,(QString *)&local_228);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lg);
        parser.sourcePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        parser.sourcePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        parser._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        parser.sourcePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        parser.symbols.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        parser._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        parser.symbols.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        parser.symbols.d.ptr = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
        bVar6 = false;
        QCss::Parser::Parser(&parser,local_188.ptr + 1,false);
        local_290 = -1;
        local_288 = -1;
        while( true ) {
          this = &lg.super_QGradient.m_stops;
          if (parser.symbols.d.size <= parser.index) break;
          QCss::Parser::skipSpace(&parser);
          if ((parser.symbols.d.size <= parser.index) ||
             (parser.symbols.d.ptr[parser.index].token != IDENT)) {
LAB_00540c6c:
            QCss::BrushData::BrushData((BrushData *)v);
            goto LAB_00540c74;
          }
          parser.index = parser.index + 1;
          local_228.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_228.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QCss::Parser::lexem((QString *)&local_228,&parser);
          QCss::Parser::skipSpace(&parser);
          if ((parser.index < parser.symbols.d.size) &&
             (parser.symbols.d.ptr[parser.index].token == COLON)) {
            parser.index = parser.index + 1;
            QCss::Parser::skipSpace(&parser);
            iVar8 = QString::compare((QLatin1String *)&local_228,4);
            if (iVar8 == 0) {
              lg.super_QGradient.m_type = LinearGradient;
              lg.super_QGradient.m_spread = 0xaaaaaaaa;
              lg.super_QGradient.m_stops.d.d = (Data *)0x0;
              lg.super_QGradient.m_stops.d.ptr = (pair<double,_QColor> *)0x0;
              lg.super_QGradient.m_stops.d.size = 0;
              lg.super_QGradient.m_data.linear.x1 = 9.88131291682493e-324;
              local_88 = (undefined1  [8])0xaaaaaaaa00000000;
              local_80.shared = (PrivateShared *)0x0;
              local_80._8_8_ = 0;
              local_80._16_8_ = 0;
              local_68 = 2;
              parser.index = parser.index + 1;
              bVar7 = QCss::Parser::parseTerm(&parser,(Value *)&lg);
              if (bVar7) {
                QCss::Parser::skipSpace(&parser);
                parser.index = parser.index + 1;
                bVar7 = QCss::Parser::parseTerm(&parser,(Value *)local_88);
                if (!bVar7) goto LAB_00540978;
                local_138 = &DAT_aaaaaaaaaaaaaaaa;
                local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                QCss::Value::Value(&local_b0,(Value *)local_88);
                parseColorValue((ColorData *)local_148,&local_b0);
                QVariant::~QVariant(&local_b0.variant);
                if (local_138._4_4_ == Role) {
                  bVar6 = true;
                }
                uVar19 = QVariant::toReal((bool *)&lg.super_QGradient.m_stops);
                if (local_138._4_4_ == Role) {
                  pQVar13 = QPalette::color(in_RDX,(ColorRole)local_138);
                  local_168.first._0_4_ = pQVar13->cspec;
                  uVar20 = *(undefined4 *)&pQVar13->ct;
                  local_168.second.cspec = *(Spec *)((long)&pQVar13->ct + 4);
                  local_168.second.ct.argb.alpha = (ushort)*(undefined4 *)((long)&pQVar13->ct + 8);
LAB_00540a09:
                  local_168.first._4_2_ = (ushort)uVar20;
                  local_168.first._6_2_ = (ushort)((uint)uVar20 >> 0x10);
                }
                else {
                  if (local_138._4_4_ == Color) {
                    local_168.first._0_4_ = local_148._0_4_;
                    uVar20 = local_148._4_4_;
                    local_168.second.cspec = local_148._8_4_;
                    local_168.second.ct.argb.alpha = local_148._12_2_;
                    goto LAB_00540a09;
                  }
                  local_168.first._0_4_ = Invalid;
                  local_168.first._4_2_ = 0xffff;
                  local_168.first._6_2_ = 0;
                  local_168.second.cspec = Invalid;
                  local_168.second.ct.argb.alpha = 0;
                }
                local_168.second.ct.argb.pad = local_168.second.ct.argb.alpha;
                local_168.second.ct._4_4_ = local_168.second.cspec;
                local_168.second.ct.argb.red = local_168.first._6_2_;
                local_168.second.ct.argb.alpha = local_168.first._4_2_;
                local_168.first._4_2_ = (ushort)((ulong)uVar19 >> 0x20);
                local_168.first._6_2_ = (ushort)((ulong)uVar19 >> 0x30);
                local_168.second.cspec = local_168.first._0_4_;
                local_168.first._0_4_ = (int)uVar19;
                QList<std::pair<double,QColor>>::emplaceBack<std::pair<double,QColor>>
                          ((QList<std::pair<double,QColor>> *)&local_1c8,&local_168);
                bVar7 = true;
              }
              else {
LAB_00540978:
                QCss::BrushData::BrushData((BrushData *)v);
                bVar7 = false;
              }
              QVariant::~QVariant((QVariant *)&local_80);
              QVariant::~QVariant((QVariant *)&lg.super_QGradient.m_stops);
              if (!bVar7) goto LAB_00540821;
            }
            else {
              parser.index = parser.index + 1;
              lg.super_QGradient.m_type = LinearGradient;
              lg.super_QGradient.m_spread = 0xaaaaaaaa;
              lg.super_QGradient.m_stops.d.d = (Data *)0x0;
              lg.super_QGradient.m_stops.d.ptr = (pair<double,_QColor> *)0x0;
              lg.super_QGradient.m_stops.d.size = 0;
              lg.super_QGradient.m_data.linear.x1 = 9.88131291682493e-324;
              QCss::Parser::parseTerm(&parser,(Value *)&lg);
              iVar8 = QString::compare((QLatin1String *)&local_228,6);
              if (iVar8 == 0) {
                QVariant::toString();
                local_288 = QListSpecialMethods<QString>::indexOf
                                      ((QListSpecialMethods<QString> *)&local_1e8,
                                       (QString *)local_88,0,CaseSensitive);
LAB_005409d4:
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_88);
              }
              else {
                iVar8 = QString::compare((QLatin1String *)&local_228,0xe);
                if (iVar8 == 0) {
                  QVariant::toString();
                  local_290 = QListSpecialMethods<QString>::indexOf
                                        ((QListSpecialMethods<QString> *)&local_208,
                                         (QString *)local_88,0,CaseSensitive);
                  goto LAB_005409d4;
                }
                dVar1 = (double)QVariant::toReal((bool *)this);
                pdVar12 = QHash<QString,_double>::operator[](&local_1d0,(QString *)&local_228);
                *pdVar12 = dVar1;
              }
              QVariant::~QVariant((QVariant *)this);
            }
            QCss::Parser::skipSpace(&parser);
            bVar7 = true;
            if ((parser.index < parser.symbols.d.size) &&
               (parser.symbols.d.ptr[parser.index].token == COMMA)) {
              parser.index = parser.index + 1;
            }
          }
          else {
            QCss::BrushData::BrushData((BrushData *)v);
LAB_00540821:
            bVar7 = false;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
          if (!bVar7) goto LAB_00540c74;
        }
        CVar9 = (CoordinateMode)local_290;
        SVar10 = (Spread)local_288;
        if (iVar17 == 2) {
          puVar15 = &DAT_00613518;
          pQVar16 = &lg.super_QGradient;
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar19 = *puVar15;
            pQVar16->m_type = (int)uVar19;
            pQVar16->m_spread = (int)((ulong)uVar19 >> 0x20);
            puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
            pQVar16 = (QGradient *)((long)pQVar16 + (ulong)bVar18 * -0x10 + 8);
          }
          local_88 = (undefined1  [8])0x2;
          local_80.shared = (PrivateShared *)0x61375b;
          dVar1 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)local_88);
          local_228.d = (Data *)0x2;
          local_228.ptr = L"cy";
          dVar2 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)&local_228);
          local_148._0_8_ = (undefined1 *)0x5;
          local_148._8_8_ = "angle";
          dVar3 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)local_148);
          QConicalGradient::QConicalGradient
                    ((QConicalGradient *)&lg.super_QGradient,dVar1,dVar2,dVar3);
          CVar5 = ObjectBoundingMode;
          if (-1 < (int)CVar9) {
            CVar5 = CVar9;
          }
          QGradient::setCoordinateMode(&lg.super_QGradient,CVar5);
          QGradient::setStops(&lg.super_QGradient,(QGradientStops *)&local_1c8);
          if (SVar10 != ~PadSpread) {
            lg.super_QGradient.m_spread = SVar10;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,&lg.super_QGradient);
          QCss::BrushData::BrushData((BrushData *)v,(QBrush *)local_88);
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar6) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)&lg);
        }
        else if (iVar17 == 1) {
          puVar15 = &DAT_006134c0;
          pQVar16 = &lg.super_QGradient;
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar19 = *puVar15;
            pQVar16->m_type = (int)uVar19;
            pQVar16->m_spread = (int)((ulong)uVar19 >> 0x20);
            puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
            pQVar16 = (QGradient *)((long)pQVar16 + (ulong)bVar18 * -0x10 + 8);
          }
          local_88 = (undefined1  [8])0x2;
          local_80.shared = (PrivateShared *)0x61375b;
          dVar1 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)local_88);
          local_228.d = (Data *)0x2;
          local_228.ptr = L"cy";
          dVar2 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)&local_228);
          local_148._0_8_ = (undefined1 *)0x6;
          local_148._8_8_ = "radius";
          dVar3 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)local_148);
          local_168.first._0_4_ = 2;
          local_168.first._4_2_ = 0;
          local_168.first._6_2_ = 0;
          local_168.second.cspec = 0x613765;
          local_168.second.ct.argb.alpha = 0;
          local_168.second.ct.argb.red = 0;
          dVar4 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)&local_168);
          local_278.m_size = 2;
          local_278.m_data = "fy";
          fy = QHash<QString,_double>::value<QLatin1String,_true>(&local_1d0,&local_278);
          QRadialGradient::QRadialGradient
                    ((QRadialGradient *)&lg.super_QGradient,dVar1,dVar2,dVar3,dVar4,fy);
          CVar5 = ObjectBoundingMode;
          if (-1 < (int)CVar9) {
            CVar5 = CVar9;
          }
          QGradient::setCoordinateMode(&lg.super_QGradient,CVar5);
          QGradient::setStops(&lg.super_QGradient,(QGradientStops *)&local_1c8);
          if (SVar10 != ~PadSpread) {
            lg.super_QGradient.m_spread = SVar10;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,&lg.super_QGradient);
          QCss::BrushData::BrushData((BrushData *)v,(QBrush *)local_88);
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar6) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)&lg);
        }
        else {
          if (iVar17 != 0) goto LAB_00540c6c;
          puVar15 = &DAT_00613468;
          pQVar16 = &lg.super_QGradient;
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar19 = *puVar15;
            pQVar16->m_type = (int)uVar19;
            pQVar16->m_spread = (int)((ulong)uVar19 >> 0x20);
            puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
            pQVar16 = (QGradient *)((long)pQVar16 + (ulong)bVar18 * -0x10 + 8);
          }
          local_88 = (undefined1  [8])0x2;
          local_80.shared = (PrivateShared *)0x613752;
          dVar1 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)local_88);
          local_228.d = (Data *)0x2;
          local_228.ptr = L"y1";
          dVar2 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)&local_228);
          local_148._0_8_ = (undefined1 *)0x2;
          local_148._8_8_ = "x2";
          dVar3 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)local_148);
          local_168.first._0_4_ = 2;
          local_168.first._4_2_ = 0;
          local_168.first._6_2_ = 0;
          local_168.second.cspec = 0x613758;
          local_168.second.ct.argb.alpha = 0;
          local_168.second.ct.argb.red = 0;
          dVar4 = QHash<QString,_double>::value<QLatin1String,_true>
                            (&local_1d0,(QLatin1String *)&local_168);
          QLinearGradient::QLinearGradient
                    ((QLinearGradient *)&lg.super_QGradient,dVar1,dVar2,dVar3,dVar4);
          CVar5 = ObjectBoundingMode;
          if (-1 < (int)CVar9) {
            CVar5 = CVar9;
          }
          QGradient::setCoordinateMode(&lg.super_QGradient,CVar5);
          QGradient::setStops(&lg.super_QGradient,(QGradientStops *)&local_1c8);
          if (SVar10 != ~PadSpread) {
            lg.super_QGradient.m_spread = SVar10;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,&lg.super_QGradient);
          QCss::BrushData::BrushData((BrushData *)v,(QBrush *)local_88);
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar6) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)&lg);
        }
LAB_00540c74:
        QCss::Parser::~Parser(&parser);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_208);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1e8);
        QArrayDataPointer<std::pair<double,_QColor>_>::~QArrayDataPointer(&local_1c8);
        QHash<QString,_double>::~QHash(&local_1d0);
        goto LAB_00540cb2;
      }
      QCss::BrushData::BrushData((BrushData *)v);
LAB_00540cb2:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
    }
    else {
      QCss::BrushData::BrushData((BrushData *)v);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
    uVar19 = extraout_RDX_02;
  }
  else {
    QCss::BrushData::BrushData((BrushData *)v);
    uVar19 = extraout_RDX_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  BVar21.role = (int)uVar19;
  BVar21.type = (int)((ulong)uVar19 >> 0x20);
  BVar21.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)v;
  return BVar21;
}

Assistant:

static BrushData parseBrushValue(const QCss::Value &v, const QPalette &pal)
{
    ColorData c = parseColorValue(v);
    if (c.type == ColorData::Color) {
        return QBrush(c.color);
    } else if (c.type == ColorData::Role) {
        return c.role;
    }

    if (v.type != Value::Function)
        return BrushData();

    QStringList lst = v.variant.toStringList();
    if (lst.size() != 2)
        return BrushData();

    QStringList gradFuncs;
    gradFuncs << "qlineargradient"_L1 << "qradialgradient"_L1 << "qconicalgradient"_L1 << "qgradient"_L1;
    int gradType = -1;

    if ((gradType = gradFuncs.indexOf(lst.at(0).toLower())) == -1)
        return BrushData();

    QHash<QString, qreal> vars;
    QList<QGradientStop> stops;

    int spread = -1;
    QStringList spreads;
    spreads << "pad"_L1 << "reflect"_L1 << "repeat"_L1;

    int coordinateMode = -1;
    QStringList coordinateModes;
    coordinateModes << "logical"_L1 << "stretchtodevice"_L1 << "objectbounding"_L1 << "object"_L1;

    bool dependsOnThePalette = false;
    Parser parser(lst.at(1));
    while (parser.hasNext()) {
        parser.skipSpace();
        if (!parser.test(IDENT))
            return BrushData();
        QString attr = parser.lexem();
        parser.skipSpace();
        if (!parser.test(COLON))
            return BrushData();
        parser.skipSpace();
        if (attr.compare("stop"_L1, Qt::CaseInsensitive) == 0) {
            QCss::Value stop, color;
            parser.next();
            if (!parser.parseTerm(&stop)) return BrushData();
            parser.skipSpace();
            parser.next();
            if (!parser.parseTerm(&color)) return BrushData();
            ColorData cd = parseColorValue(color);
            if (cd.type == ColorData::Role)
                dependsOnThePalette = true;
            stops.append(QGradientStop(stop.variant.toReal(), colorFromData(cd, pal)));
        } else {
            parser.next();
            QCss::Value value;
            (void)parser.parseTerm(&value);
            if (attr.compare("spread"_L1, Qt::CaseInsensitive) == 0)
                spread = spreads.indexOf(value.variant.toString());
            else if (attr.compare("coordinatemode"_L1, Qt::CaseInsensitive) == 0)
                coordinateMode = coordinateModes.indexOf(value.variant.toString());
            else
                vars[attr] = value.variant.toReal();
        }
        parser.skipSpace();
        (void)parser.test(COMMA);
    }

    if (gradType == 0) {
        QLinearGradient lg(vars.value("x1"_L1), vars.value("y1"_L1),
                           vars.value("x2"_L1), vars.value("y2"_L1));
        lg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        lg.setStops(stops);
        if (spread != -1)
            lg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(lg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 1) {
        QRadialGradient rg(vars.value("cx"_L1), vars.value("cy"_L1),
                           vars.value("radius"_L1), vars.value("fx"_L1),
                           vars.value("fy"_L1));
        rg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        rg.setStops(stops);
        if (spread != -1)
            rg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(rg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 2) {
        QConicalGradient cg(vars.value("cx"_L1), vars.value("cy"_L1), vars.value("angle"_L1));
        cg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        cg.setStops(stops);
        if (spread != -1)
            cg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(cg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    return BrushData();
}